

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ClearJoins(Clipper *this)

{
  pointer ppJVar1;
  ulong uVar2;
  
  ppJVar1 = (this->m_Joins).
            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppJVar1) {
    uVar2 = 0;
    do {
      operator_delete(ppJVar1[uVar2],0x20);
      uVar2 = uVar2 + 1;
      ppJVar1 = (this->m_Joins).
                super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_Joins).
                                   super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3))
    ;
  }
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::resize(&this->m_Joins,0);
  return;
}

Assistant:

void Clipper::ClearJoins()
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
    delete m_Joins[i];
  m_Joins.resize(0);
}